

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O1

void Handler_duration_I_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  long lVar2;
  int iVar3;
  PClassActor *pPVar4;
  
  lVar2 = 0x4fc;
  pPVar4 = info;
  if ((PClassActor *)APowerup::RegistrationInfo.MyClass != info) {
    do {
      pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
      if (pPVar4 == (PClassActor *)APowerup::RegistrationInfo.MyClass) break;
    } while (pPVar4 != (PClassActor *)0x0);
    if ((pPVar4 == (PClassActor *)0x0) &&
       (lVar2 = 0x508, (PClassActor *)APowerupGiver::RegistrationInfo.MyClass != info)) {
      do {
        info = (PClassActor *)(info->super_PClass).ParentClass;
        if (info == (PClassActor *)APowerupGiver::RegistrationInfo.MyClass) break;
      } while (info != (PClassActor *)0x0);
      if (info == (PClassActor *)0x0) {
        I_Error("\"powerup.duration\" requires an actor of type \"Powerup\"\n");
        return;
      }
    }
  }
  iVar1 = params[1].i;
  iVar3 = iVar1 * -0x23;
  if (-1 < iVar1) {
    iVar3 = iVar1;
  }
  *(int *)((long)&(defaults->super_AActor).super_DThinker.super_DObject._vptr_DObject + lVar2) =
       iVar3;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(powerup, duration, I, Inventory)
{
	int *pEffectTics;

	if (info->IsDescendantOf(RUNTIME_CLASS(APowerup)))
	{
		pEffectTics = &((APowerup*)defaults)->EffectTics;
	}
	else if (info->IsDescendantOf(RUNTIME_CLASS(APowerupGiver)))
	{
		pEffectTics = &((APowerupGiver*)defaults)->EffectTics;
	}
	else
	{
		I_Error("\"powerup.duration\" requires an actor of type \"Powerup\"\n");
		return;
	}

	PROP_INT_PARM(i, 0);
	*pEffectTics = (i >= 0) ? i : -i * TICRATE;
}